

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

const_iterator * __thiscall
compressed_sparse_matrix<filtration_entry_t>::cend
          (compressed_sparse_matrix<filtration_entry_t> *this,size_t index)

{
  deque<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  const_iterator *in_RDI;
  deque<filtration_entry_t,_std::allocator<filtration_entry_t>_> *in_stack_ffffffffffffffa8;
  const_iterator *__x;
  
  __x = in_RDI;
  std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::cbegin
            (in_stack_ffffffffffffffa8);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            (in_RSI,(size_type)in_stack_ffffffffffffffa8);
  std::operator+(__x,(difference_type)in_RSI);
  return in_RDI;
}

Assistant:

typename std::deque<ValueType>::const_iterator cend(size_t index) const {
		assert(index < size());
		return entries.cbegin() + bounds[index];
	}